

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O0

int __thiscall
highs::RbTree<HighsNodeQueue::SuboptimalNodeRbTree>::link
          (RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *this,char *__from,char *__to)

{
  int iVar1;
  LinkType x;
  LinkType y;
  LinkType in_stack_ffffffffffffffa8;
  RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *this_00;
  KeyType local_40;
  KeyType local_30;
  RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *local_20;
  RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *local_18;
  char *local_10;
  RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *local_8;
  
  local_18 = (RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *)0xffffffffffffffff;
  local_20 = (RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *)*this->rootNode;
  local_10 = __from;
  local_8 = this;
  while (local_20 != (RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *)0xffffffffffffffff) {
    local_18 = local_20;
    this_00 = local_20;
    local_30 = getKey(local_20,in_stack_ffffffffffffffa8);
    local_40 = getKey(this_00,in_stack_ffffffffffffffa8);
    std::operator<(&local_30,&local_40);
    local_20 = (RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *)
               getChild(this_00,in_stack_ffffffffffffffa8,kLeft);
  }
  iVar1 = CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree>::link
                    ((CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree> *)this,local_10,
                     (char *)local_18);
  return iVar1;
}

Assistant:

void link(LinkType z) {
    LinkType y = kNoLink;
    LinkType x = rootNode;
    while (x != kNoLink) {
      y = x;
      x = getChild(y, Dir(getKey(x) < getKey(z)));
    }

    static_cast<Impl*>(this)->link(z, y);
  }